

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-io.cpp
# Opt level: O1

void __thiscall wasm::ModuleWriter::writeBinary(ModuleWriter *this,Module *wasm,string *filename)

{
  bool bVar1;
  ostream *poVar2;
  undefined1 local_338 [8];
  Output output;
  
  bVar1 = isDebugEnabled("writer");
  if (bVar1) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"writing binary to ",0x12);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,(filename->_M_dataplus)._M_p,
                        filename->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
  }
  Output::Output((Output *)local_338,filename,Binary);
  writeBinary(this,wasm,(Output *)local_338);
  Output::~Output((Output *)local_338);
  return;
}

Assistant:

void ModuleWriter::writeBinary(Module& wasm, std::string filename) {
  BYN_TRACE("writing binary to " << filename << "\n");
  Output output(filename, Flags::Binary);
  writeBinary(wasm, output);
}